

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileTests.cpp
# Opt level: O1

void globAndCheck(path *basePath,string_view pattern,GlobMode mode,GlobRank expectedRank,
                 error_code expectedEc,initializer_list<const_char_*> expected)

{
  _Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false> _Var1;
  char cVar2;
  undefined4 uVar3;
  int iVar4;
  long lVar5;
  path *ppVar6;
  _List *p_Var7;
  long *extraout_RDX;
  path *ppVar8;
  long lVar9;
  AssertionHandler *pAVar10;
  AssertionHandler *expr;
  _List *p_Var11;
  StringRef macroName;
  StringRef macroName_00;
  StringRef macroName_01;
  StringRef macroName_02;
  StringRef macroName_03;
  StringRef macroName_04;
  string_view pattern_00;
  StringRef capturedExpression;
  StringRef capturedExpression_00;
  StringRef capturedExpression_01;
  StringRef capturedExpression_02;
  AssertionHandler catchAssertionHandler;
  GlobRank rank;
  char *str;
  error_code ec;
  SmallVector<std::filesystem::__cxx11::path,_2UL> results;
  error_code *in_stack_fffffffffffffdc0;
  undefined1 local_238 [40];
  long *local_210;
  char local_1dd;
  long *local_1d8;
  undefined1 local_1d0 [48];
  ostream *poStack_1a0;
  _Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false> local_188;
  SourceLineInfo local_180;
  iterator local_170;
  int local_168 [2];
  error_category *local_160;
  undefined1 local_158 [8];
  undefined8 local_150;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_148;
  _List local_138;
  undefined1 *local_130;
  path local_128;
  path *local_100;
  char *local_f8;
  iterator local_f0;
  undefined1 local_e8 [48];
  char *local_b8;
  undefined8 local_b0;
  path local_a8 [3];
  
  pattern_00._M_len = pattern._M_str;
  local_e8._40_8_ = local_a8;
  local_b8 = (char *)0x0;
  local_b0._0_1_ = true;
  local_b0._1_1_ = false;
  local_b0._2_1_ = false;
  local_b0._3_1_ = false;
  local_b0._4_4_ = 0;
  local_168[0] = 0;
  local_1d0._36_4_ = expectedRank;
  local_160 = (error_category *)std::_V2::system_category();
  pattern_00._M_str._0_4_ = mode;
  pattern_00._M_str._4_4_ = 0;
  local_238._28_4_ = mode;
  local_100 = (path *)pattern._M_len;
  local_f8 = pattern_00._M_len;
  local_1d0._32_4_ =
       slang::svGlob((slang *)basePath,(path *)pattern._M_len,pattern_00,(int)local_e8 + 0x28,
                     (SmallVector<std::filesystem::__cxx11::path,_2UL> *)0x1,SUB81(local_168,0),
                     in_stack_fffffffffffffdc0);
  local_158 = (undefined1  [8])0xa3516b;
  local_150 = 0x67;
  macroName.m_size = 5;
  macroName.m_start = "CHECK";
  capturedExpression.m_size = 0x14;
  capturedExpression.m_start = "rank == expectedRank";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)(local_238 + 0x20),macroName,(SourceLineInfo *)local_158,
             capturedExpression,ContinueOnFailure);
  local_148._M_allocated_capacity = (size_type)(local_1d0 + 0x20);
  local_130 = local_1d0 + 0x24;
  local_150._0_2_ = CONCAT11(local_1d0._32_4_ == local_1d0._36_4_,true);
  local_158 = (undefined1  [8])&PTR_streamReconstructedExpression_00cbc070;
  local_148._8_8_ = (long)"!==" + 1;
  local_138._M_impl._M_t.
  super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
  ._M_t.
  super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
  .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>._M_head_impl =
       (unique_ptr<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
        )(__uniq_ptr_data<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter,_true,_true>
          )0x2;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)(local_238 + 0x20),(ITransientExpression *)local_158);
  Catch::AssertionHandler::complete((AssertionHandler *)(local_238 + 0x20));
  if (local_1dd == '\0') {
    (**(code **)(*local_1d8 + 0xa0))();
  }
  local_158 = (undefined1  [8])0xa3516b;
  local_150 = 0x68;
  macroName_00.m_size = 5;
  macroName_00.m_start = "CHECK";
  capturedExpression_00.m_size = 0x21;
  capturedExpression_00.m_start = "results.size() == expected.size()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)(local_238 + 0x20),macroName_00,(SourceLineInfo *)local_158,
             capturedExpression_00,ContinueOnFailure);
  expr = (AssertionHandler *)local_158;
  local_150._0_2_ = CONCAT11(local_b8 == (char *)expected._M_len,true);
  local_158 = (undefined1  [8])&PTR_streamReconstructedExpression_00cb5bc0;
  local_148._M_allocated_capacity = (size_type)local_b8;
  local_148._8_8_ = (long)"!==" + 1;
  local_138._M_impl._M_t.
  super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
  ._M_t.
  super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
  .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>._M_head_impl =
       (unique_ptr<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
        )(__uniq_ptr_data<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter,_true,_true>
          )0x2;
  local_130 = (undefined1 *)expected._M_len;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)(local_238 + 0x20),(ITransientExpression *)expr);
  Catch::AssertionHandler::complete((AssertionHandler *)(local_238 + 0x20));
  if (local_1dd == '\0') {
    expr = (AssertionHandler *)(local_238 + 0x20);
    (**(code **)(*local_1d8 + 0xa0))();
  }
  pAVar10 = (AssertionHandler *)&expectedEc;
  if ((local_160 != expectedEc._M_cat) || (local_168[0] != expectedEc._M_value)) {
    uVar3 = std::error_code::default_error_condition();
    local_238._32_4_ = uVar3;
    expr = (AssertionHandler *)(ulong)(uint)expectedEc._M_value;
    local_210 = extraout_RDX;
    cVar2 = (**(code **)(*(long *)expectedEc._M_cat + 0x30))
                      (expectedEc._M_cat,expr,local_238 + 0x20);
    if ((cVar2 == '\0') &&
       (cVar2 = (**(code **)(*local_210 + 0x38))(local_210,pAVar10,local_238._32_8_ & 0xffffffff),
       expr = pAVar10, cVar2 == '\0')) {
      local_158 = (undefined1  [8])0xa3516b;
      local_150 = 0x6b;
      macroName_01.m_size = 10;
      macroName_01.m_start = "FAIL_CHECK";
      Catch::AssertionHandler::AssertionHandler
                ((AssertionHandler *)(local_238 + 0x20),macroName_01,(SourceLineInfo *)local_158,
                 (StringRef)ZEXT816(0xa04334),ContinueOnFailure);
      local_1d0._40_8_ = 0;
      poStack_1a0 = (ostream *)0x0;
      Catch::ReusableStringStream::ReusableStringStream((ReusableStringStream *)(local_1d0 + 0x28));
      (**(code **)(*(long *)local_160 + 0x20))(local_e8,local_160,local_168[0]);
      std::__ostream_insert<char,std::char_traits<char>>
                (poStack_1a0,(char *)local_e8._0_8_,local_e8._8_8_);
      std::__ostream_insert<char,std::char_traits<char>>(poStack_1a0," != ",4);
      (**(code **)(*(long *)expectedEc._M_cat + 0x20))
                (&local_128,expectedEc._M_cat,expectedEc._M_value);
      std::__ostream_insert<char,std::char_traits<char>>
                (poStack_1a0,local_128._M_pathname._M_dataplus._M_p,
                 local_128._M_pathname._M_string_length);
      Catch::ReusableStringStream::str_abi_cxx11_
                ((string *)local_158,(ReusableStringStream *)(local_1d0 + 0x28));
      expr = (AssertionHandler *)0x12;
      Catch::AssertionHandler::handleMessage
                ((AssertionHandler *)(local_238 + 0x20),ExplicitFailure,(string *)local_158);
      if (local_158 != (undefined1  [8])&local_148) {
        expr = (AssertionHandler *)(local_148._M_allocated_capacity + 1);
        operator_delete((void *)local_158,(size_t)expr);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_128._M_pathname._M_dataplus._M_p != &local_128._M_pathname.field_2) {
        expr = (AssertionHandler *)(local_128._M_pathname.field_2._M_allocated_capacity + 1);
        operator_delete(local_128._M_pathname._M_dataplus._M_p,(size_t)expr);
      }
      if ((undefined1 *)local_e8._0_8_ != local_e8 + 0x10) {
        expr = (AssertionHandler *)(local_e8._16_8_ + 1);
        operator_delete((void *)local_e8._0_8_,(size_t)expr);
      }
      Catch::ReusableStringStream::~ReusableStringStream((ReusableStringStream *)(local_1d0 + 0x28))
      ;
      Catch::AssertionHandler::complete((AssertionHandler *)(local_238 + 0x20));
      if (local_1dd == '\0') {
        expr = (AssertionHandler *)(local_238 + 0x20);
        (**(code **)(*local_1d8 + 0xa0))();
      }
    }
  }
  if (expected._M_len != 0) {
    local_f0 = expected._M_array + expected._M_len;
    pAVar10 = (AssertionHandler *)(local_a8 + 2);
    do {
      local_238._32_8_ = *expected._M_array;
      local_210 = (long *)CONCAT44(local_210._4_4_,local_238._28_4_);
      ppVar8 = (path *)local_e8._40_8_;
      local_180.file = (char *)local_238._32_8_;
      if (local_b8 != (char *)0x0) {
        p_Var11 = (_List *)(local_e8._40_8_ + 0x20);
        lVar9 = (long)local_b8 * 0x28;
        local_170 = expected._M_array;
        do {
          ppVar8 = (path *)(p_Var11 + -4);
          cVar2 = std::filesystem::__cxx11::path::has_filename();
          if (cVar2 == '\0') {
            std::filesystem::__cxx11::path::parent_path();
            if (poStack_1a0 == (ostream *)0x0) {
LAB_005a33ef:
              std::filesystem::__cxx11::path::path(&local_128);
            }
            else {
              ppVar8 = (path *)(local_1d0 + 0x28);
              if ((~(byte)local_188._M_head_impl & 3) != 0) {
                if ((((ulong)local_188._M_head_impl & 3) == 0) &&
                   (poStack_1a0[local_1d0._40_8_ - 1] != (ostream)0x2f)) {
                  if (((ulong)local_188._M_head_impl & 3) == 0) {
                    ppVar6 = (path *)std::filesystem::__cxx11::path::_List::end();
                  }
                  else {
                    ppVar6 = (path *)0x0;
                  }
                  ppVar8 = (path *)&ppVar6[-2]._M_cmpts;
                  if (((ulong)local_188._M_head_impl & 3) != 0) {
                    ppVar8 = ppVar6;
                  }
                  p_Var7 = &ppVar8->_M_cmpts;
                  if (((ulong)local_188._M_head_impl & 3) != 0) {
                    p_Var7 = (_List *)&local_188;
                  }
                  if ((~*(uint *)&(p_Var7->_M_impl)._M_t.
                                  super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                                  .
                                  super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>
                                  ._M_head_impl & 3) == 0) {
                    if (((ulong)local_188._M_head_impl & 3) != 0) {
                      ppVar8 = (path *)(local_1d0 + 0x28);
                    }
                    goto LAB_005a33e0;
                  }
                }
                goto LAB_005a33ef;
              }
LAB_005a33e0:
              std::filesystem::__cxx11::path::path(&local_128,ppVar8);
            }
            std::filesystem::__cxx11::path::path<char_const*,std::filesystem::__cxx11::path>
                      ((path *)pAVar10,(char **)(local_238 + 0x20),auto_format);
            ppVar8 = &local_128;
            expr = pAVar10;
          }
          else {
            if (*(size_type *)(p_Var11 + -3) == 0) {
LAB_005a336f:
              std::filesystem::__cxx11::path::path((path *)local_158);
            }
            else {
              _Var1._M_head_impl =
                   (p_Var11->_M_impl)._M_t.
                   super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                   ._M_t.
                   super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                   .super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>.
                   _M_head_impl;
              if (((ulong)_Var1._M_head_impl & 3) == 0) {
                if ((ppVar8->_M_pathname)._M_dataplus._M_p[*(size_type *)(p_Var11 + -3) - 1] != '/')
                {
                  if (((ulong)_Var1._M_head_impl & 3) == 0) {
                    lVar5 = std::filesystem::__cxx11::path::_List::end();
                  }
                  else {
                    lVar5 = 0;
                  }
                  if ((*(byte *)&(p_Var11->_M_impl)._M_t.
                                 super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                                 .
                                 super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>
                                 ._M_head_impl & 3) == 0) {
                    ppVar8 = (path *)(lVar5 + -0x30);
                  }
                  if ((~*(uint *)&(ppVar8->_M_cmpts)._M_impl._M_t.
                                  super___uniq_ptr_impl<std::filesystem::__cxx11::path::_List::_Impl,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_std::filesystem::__cxx11::path::_List::_Impl_deleter>
                                  .
                                  super__Head_base<0UL,_std::filesystem::__cxx11::path::_List::_Impl_*,_false>
                                  ._M_head_impl & 3) == 0) goto LAB_005a32b4;
                }
                goto LAB_005a336f;
              }
              if (((uint)_Var1._M_head_impl & 3) != 3) goto LAB_005a336f;
LAB_005a32b4:
              std::filesystem::__cxx11::path::path((path *)local_158,ppVar8);
            }
            std::filesystem::__cxx11::path::path<char_const*,std::filesystem::__cxx11::path>
                      ((path *)local_e8,(char **)(local_238 + 0x20),auto_format);
            ppVar8 = (path *)local_158;
            expr = (AssertionHandler *)local_e8;
          }
          iVar4 = std::filesystem::__cxx11::path::compare(ppVar8);
          if (cVar2 == '\0') {
            std::filesystem::__cxx11::path::~path((path *)pAVar10);
            std::filesystem::__cxx11::path::~path(&local_128);
            ppVar8 = (path *)(local_1d0 + 0x28);
          }
          else {
            std::filesystem::__cxx11::path::~path((path *)local_e8);
            ppVar8 = (path *)local_158;
          }
          std::filesystem::__cxx11::path::~path(ppVar8);
          if (iVar4 == 0) break;
          p_Var11 = p_Var11 + 5;
          lVar9 = lVar9 + -0x28;
        } while (lVar9 != 0);
        ppVar8 = (path *)(p_Var11 + -4);
        expected._M_array = local_170;
      }
      if (ppVar8 == (path *)(local_e8._40_8_ + local_b8 * 0x28)) {
        local_1d0._0_8_ =
             "/workspace/llm4binary/github/license_c_cmakelists/MikePopoloski[P]slang/tests/unittests/FileTests.cpp"
        ;
        local_1d0._8_8_ = 0x73;
        macroName_02.m_size = 10;
        macroName_02.m_start = "FAIL_CHECK";
        Catch::AssertionHandler::AssertionHandler
                  ((AssertionHandler *)(local_238 + 0x20),macroName_02,(SourceLineInfo *)local_1d0,
                   (StringRef)ZEXT816(0xa04334),ContinueOnFailure);
        local_238._0_8_ = (undefined **)0x0;
        local_238._8_8_ = (ostream *)0x0;
        Catch::ReusableStringStream::ReusableStringStream((ReusableStringStream *)local_238);
        Catch::ReusableStringStream::operator<<((ReusableStringStream *)local_238,&local_180.file);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_238._8_8_," is not found in results for ",0x1d);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_238._8_8_,local_f8,(long)local_100);
        Catch::ReusableStringStream::str_abi_cxx11_
                  ((string *)local_1d0,(ReusableStringStream *)local_238);
        expr = (AssertionHandler *)0x12;
        Catch::AssertionHandler::handleMessage
                  ((AssertionHandler *)(local_238 + 0x20),ExplicitFailure,(string *)local_1d0);
        if ((undefined1 *)local_1d0._0_8_ != local_1d0 + 0x10) {
          expr = (AssertionHandler *)(local_1d0._16_8_ + 1);
          operator_delete((void *)local_1d0._0_8_,(size_t)expr);
        }
        Catch::ReusableStringStream::~ReusableStringStream((ReusableStringStream *)local_238);
        Catch::AssertionHandler::complete((AssertionHandler *)(local_238 + 0x20));
        if (local_1dd == '\0') {
          expr = (AssertionHandler *)(local_238 + 0x20);
          (**(code **)(*local_1d8 + 0xa0))();
        }
      }
      expected._M_array = expected._M_array + 1;
    } while (expected._M_array != local_f0);
  }
  if (local_b8 != (char *)0x0) {
    lVar9 = (long)local_b8 * 0x28;
    pAVar10 = (AssertionHandler *)(local_238 + 0x20);
    ppVar8 = (path *)local_e8._40_8_;
    do {
      if (local_238._28_4_ == Files) {
        local_180.file =
             "/workspace/llm4binary/github/license_c_cmakelists/MikePopoloski[P]slang/tests/unittests/FileTests.cpp"
        ;
        local_180.line = 0x79;
        macroName_04.m_size = 5;
        macroName_04.m_start = "CHECK";
        capturedExpression_02.m_size = 0x19;
        capturedExpression_02.m_start = "fs::is_regular_file(path)";
        Catch::AssertionHandler::AssertionHandler
                  (pAVar10,macroName_04,&local_180,capturedExpression_02,ContinueOnFailure);
        cVar2 = std::filesystem::status(ppVar8);
        local_238._0_8_ = &PTR_streamReconstructedExpression_00cb35e0;
        local_238._8_8_ =
             (ulong)CONCAT52(local_238._11_5_,CONCAT11(cVar2 == '\x01',cVar2 == '\x01')) << 8;
        expr = (AssertionHandler *)local_238;
        Catch::AssertionHandler::handleExpr(pAVar10,(ITransientExpression *)expr);
        Catch::AssertionHandler::complete(pAVar10);
        if (local_1dd == '\0') {
          expr = pAVar10;
          (**(code **)(*local_1d8 + 0xa0))();
        }
      }
      else {
        local_180.file =
             "/workspace/llm4binary/github/license_c_cmakelists/MikePopoloski[P]slang/tests/unittests/FileTests.cpp"
        ;
        local_180.line = 0x7b;
        macroName_03.m_size = 5;
        macroName_03.m_start = "CHECK";
        capturedExpression_01.m_size = 0x16;
        capturedExpression_01.m_start = "fs::is_directory(path)";
        Catch::AssertionHandler::AssertionHandler
                  (pAVar10,macroName_03,&local_180,capturedExpression_01,ContinueOnFailure);
        cVar2 = std::filesystem::status(ppVar8);
        local_1d0._0_8_ = &PTR_streamReconstructedExpression_00cb35e0;
        local_1d0._8_8_ =
             (ulong)CONCAT52(local_1d0._11_5_,CONCAT11(cVar2 == '\x02',cVar2 == '\x02')) << 8;
        expr = (AssertionHandler *)local_1d0;
        Catch::AssertionHandler::handleExpr(pAVar10,(ITransientExpression *)expr);
        Catch::AssertionHandler::complete(pAVar10);
        if (local_1dd == '\0') {
          expr = pAVar10;
          (**(code **)(*local_1d8 + 0xa0))();
        }
      }
      ppVar8 = ppVar8 + 1;
      lVar9 = lVar9 + -0x28;
    } while (lVar9 != 0);
  }
  slang::SmallVectorBase<std::filesystem::__cxx11::path>::cleanup
            ((SmallVectorBase<std::filesystem::__cxx11::path> *)(local_e8 + 0x28),
             (EVP_PKEY_CTX *)expr);
  return;
}

Assistant:

static void globAndCheck(const fs::path& basePath, std::string_view pattern, GlobMode mode,
                         GlobRank expectedRank, std::error_code expectedEc,
                         std::initializer_list<const char*> expected) {
    SmallVector<fs::path> results;
    std::error_code ec;
    auto rank = svGlob(basePath, pattern, mode, results, /* expandEnvVars */ true, ec);

    CHECK(rank == expectedRank);
    CHECK(results.size() == expected.size());

    if (ec != expectedEc && ec.default_error_condition() != expectedEc)
        FAIL_CHECK(ec.message() << " != " << expectedEc.message());

    for (auto str : expected) {
        auto it = std::ranges::find_if(results, [str, mode](auto& item) {
            return item.has_filename() ? item.filename() == str
                                       : item.parent_path().filename() == str;
        });
        if (it == results.end()) {
            FAIL_CHECK(str << " is not found in results for " << pattern);
        }
    }

    for (auto& path : results) {
        if (mode == GlobMode::Files)
            CHECK(fs::is_regular_file(path));
        else
            CHECK(fs::is_directory(path));
    }
}